

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

void computeParentHash(tree_t *tree,uint child,uint8_t *salt,picnic_instance_t *params)

{
  _Bool _Var1;
  uint uVar2;
  bitset_word_t bVar3;
  uint in_ESI;
  tree_t *in_RDI;
  hash_context ctx;
  uint parent;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  uint16_t in_stack_fffffffffffffefe;
  hash_context *in_stack_ffffffffffffff00;
  
  bVar3 = exists((tree_t *)
                 CONCAT26(in_stack_fffffffffffffefe,
                          CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),0);
  if (bVar3 != 0) {
    uVar2 = getParent(in_ESI);
    _Var1 = haveNode((tree_t *)in_stack_ffffffffffffff00,
                     CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
    if (((!_Var1) &&
        (_Var1 = haveNode((tree_t *)in_stack_ffffffffffffff00,
                          CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)), _Var1)) &&
       (_Var1 = existsNotHaveNode(in_RDI,uVar2 * 2 + 2), !_Var1)) {
      hash_init_prefix(in_stack_ffffffffffffff00,
                       CONCAT26(in_stack_fffffffffffffefe,
                                CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),'\0')
      ;
      hash_update(in_stack_ffffffffffffff00,
                  (uint8_t *)
                  CONCAT26(in_stack_fffffffffffffefe,
                           CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),0x159129);
      _Var1 = hasRightChild((tree_t *)in_stack_ffffffffffffff00,
                            CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
      if (_Var1) {
        hash_update(in_stack_ffffffffffffff00,
                    (uint8_t *)
                    CONCAT26(in_stack_fffffffffffffefe,
                             CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),0x159184
                   );
      }
      hash_update(in_stack_ffffffffffffff00,
                  (uint8_t *)
                  CONCAT26(in_stack_fffffffffffffefe,
                           CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),0x159199);
      hash_update_uint16_le(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
      hash_final((hash_context *)0x1591b3);
      hash_squeeze(in_stack_ffffffffffffff00,
                   (uint8_t *)
                   CONCAT26(in_stack_fffffffffffffefe,
                            CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),0x1591ef)
      ;
      markNode((tree_t *)in_stack_ffffffffffffff00,
               CONCAT22(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc));
    }
  }
  return;
}

Assistant:

static void computeParentHash(tree_t* tree, unsigned int child, uint8_t* salt,
                              const picnic_instance_t* params) {
  if (!exists(tree, child)) {
    return;
  }

  unsigned int parent = getParent(child);
  if (haveNode(tree, parent)) {
    return;
  }

  /* Compute the hash for parent, if we have everything */
  if (!haveNode(tree, 2 * parent + 1)) {
    return;
  }

  if (existsNotHaveNode(tree, 2 * parent + 2)) {
    return;
  }

  /* Compute parent data = H(left child data || [right child data] || salt || parent idx) */
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_3);
  hash_update(&ctx, &tree->nodes[(2 * parent + 1) * params->digest_size], params->digest_size);
  if (hasRightChild(tree, parent)) {
    /* One node may not have a right child when there's an odd number of leaves */
    hash_update(&ctx, &tree->nodes[(2 * parent + 2) * params->digest_size], params->digest_size);
  }

  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, parent);
  hash_final(&ctx);
  hash_squeeze(&ctx, &tree->nodes[parent * params->digest_size], params->digest_size);
  hash_clear(&ctx);
  markNode(tree, parent);
}